

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O0

void __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Keyframes,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::Table(Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Keyframes,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *this)

{
  DataNode<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Keyframes,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
  *pDVar1;
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Keyframes,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_local;
  
  pDVar1 = reinterpret_cast_no_cast_align_warning<robin_hood::detail::Table<true,80ul,std::__cxx11::string,Rml::Keyframes,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>::DataNode<robin_hood::detail::Table<true,80ul,std::__cxx11::string,Rml::Keyframes,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>,true>*>
                     (&this->mMask);
  this->mKeyVals = pDVar1;
  this->mInfo = (uint8_t *)&this->mMask;
  this->mNumElements = 0;
  this->mMask = 0;
  this->mMaxNumElementsAllowed = 0;
  this->mInfoInc = 0x20;
  this->mInfoHashShift = 0;
  return;
}

Assistant:

Table() noexcept(noexcept(Hash()) && noexcept(KeyEqual()))
        : WHash()
        , WKeyEqual() {
        ROBIN_HOOD_TRACE(this)
    }